

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<std::array<tinyusdz::value::half,_2UL>_> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<std::array<tinyusdz::value::half,2ul>>
          (optional<std::array<tinyusdz::value::half,_2UL>_> *__return_storage_ptr__,PrimVar *this)

{
  optional<std::array<tinyusdz::value::half,_2UL>_> local_1e;
  PrimVar *local_18;
  PrimVar *this_local;
  
  local_18 = this;
  this_local = (PrimVar *)__return_storage_ptr__;
  get_value<std::array<tinyusdz::value::half,2ul>>(&local_1e,this);
  nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::
  optional<std::array<tinyusdz::value::half,_2UL>,_0>(__return_storage_ptr__,&local_1e);
  nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::~optional(&local_1e);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }